

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O0

MPP_RET hal_h264e_vepu540c_deinit(void *hal)

{
  HalH264eVepu540cCtx *p;
  void *hal_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_deinit",hal);
  }
  h264e_vepu_stream_amend_deinit((HalH264eVepuStreamAmend *)((long)hal + 0x70));
  if (*(long *)((long)hal + 8) != 0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 8));
    *(undefined8 *)((long)hal + 8) = 0;
  }
  if (*(long *)((long)hal + 0x178) != 0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x178),"hal_h264e_vepu540c_deinit");
    *(undefined8 *)((long)hal + 0x178) = 0;
  }
  if (*(long *)((long)hal + 0x168) != 0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x168));
    *(undefined8 *)((long)hal + 0x168) = 0;
  }
  if (*(long *)((long)hal + 0x18) != 0) {
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x18));
    *(undefined8 *)((long)hal + 0x18) = 0;
  }
  if (*(long *)((long)hal + 0x160) != 0) {
    mpp_osal_free("hal_h264e_vepu540c_deinit",*(void **)((long)hal + 0x160));
  }
  *(undefined8 *)((long)hal + 0x160) = 0;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_deinit",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_deinit(void *hal)
{
    HalH264eVepu540cCtx *p = (HalH264eVepu540cCtx *)hal;
    hal_h264e_dbg_func("enter %p\n", p);

    h264e_vepu_stream_amend_deinit(&p->amend);

    if (p->dev) {
        mpp_dev_deinit(p->dev);
        p->dev = NULL;
    }

    if (p->ext_line_buf) {
        mpp_buffer_put(p->ext_line_buf);
        p->ext_line_buf = NULL;
    }

    if (p->ext_line_buf_grp) {
        mpp_buffer_group_put(p->ext_line_buf_grp);
        p->ext_line_buf_grp = NULL;
    }

    if (p->hw_recn) {
        hal_bufs_deinit(p->hw_recn);
        p->hw_recn = NULL;
    }

    MPP_FREE(p->regs_set);


    hal_h264e_dbg_func("leave %p\n", p);

    return MPP_OK;
}